

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O1

QFunctionPointer anon_unknown.dwarf_1b28eca::getProcAddress(QOpenGLContext *context,char *funcName)

{
  QFunctionPointer p_Var1;
  size_t sVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char fn [512];
  char acStack_238 [520];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = QOpenGLContext::getProcAddress(context,funcName);
  if (p_Var1 == (QFunctionPointer)0x0) {
    memset(acStack_238,0xaa,0x200);
    sVar2 = strlen(funcName);
    __memcpy_chk(acStack_238,funcName,sVar2,0x200);
    lVar3 = 0;
    do {
      memcpy(acStack_238 + sVar2,*(void **)((long)&getProcAddress::extensions[0].name + lVar3),
             (long)*(int *)((long)&getProcAddress::extensions[0].len + lVar3));
      p_Var1 = QOpenGLContext::getProcAddress(context,acStack_238);
      if (p_Var1 != (QFunctionPointer)0x0) break;
      bVar4 = lVar3 != 0x40;
      lVar3 = lVar3 + 0x10;
    } while (bVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

static QFunctionPointer getProcAddress(QOpenGLContext *context, const char *funcName)
{
    QFunctionPointer function = context->getProcAddress(funcName);

    static const struct {
        const char *name;
        int len; // includes trailing \0
    } extensions[] = {
        { "ARB", 4 },
        { "OES", 4 },
        { "EXT", 4 },
        { "ANGLE", 6 },
        { "NV", 3 },
    };

    if (!function) {
        char fn[512];
        size_t size = strlen(funcName);
        Q_ASSERT(size < 500);
        memcpy(fn, funcName, size);
        char *ext = fn + size;

        for (const auto &e : extensions) {
            memcpy(ext, e.name, e.len);
            function = context->getProcAddress(fn);
            if (function)
                break;
        }
    }

    return function;
}